

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands,
               uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,uint16_t *cmd_bits,
               uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  
  if (n_commands != 0) {
    uVar13 = *storage_ix;
    sVar16 = 0;
    do {
      uVar2 = commands[sVar16].cmd_prefix_;
      bVar1 = cmd_depth[uVar2];
      if (cmd_bits[uVar2] >> (bVar1 & 0x3f) != 0) {
LAB_00119c3b:
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < bVar1) {
LAB_00119c1c:
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      uVar12 = commands[sVar16].insert_len_;
      uVar10 = (ulong)uVar12;
      uVar14 = commands[sVar16].copy_len_;
      uVar4 = commands[sVar16].dist_extra_;
      uVar3 = commands[sVar16].dist_prefix_;
      *(ulong *)(storage + (uVar13 >> 3)) =
           (ulong)cmd_bits[uVar2] << ((byte)uVar13 & 7) | (ulong)storage[uVar13 >> 3];
      uVar13 = bVar1 + uVar13;
      *storage_ix = uVar13;
      uVar7 = uVar12;
      if (5 < uVar12) {
        if (uVar12 < 0x82) {
          uVar7 = 0x1f;
          uVar5 = (uint)(uVar10 - 2);
          if (uVar5 != 0) {
            for (; uVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          iVar6 = (uVar7 ^ 0xffffffe0) + 0x1f;
          uVar7 = (int)(uVar10 - 2 >> ((byte)iVar6 & 0x3f)) + iVar6 * 2 + 2;
        }
        else if (uVar12 < 0x842) {
          uVar7 = 0x1f;
          if (uVar12 - 0x42 != 0) {
            for (; uVar12 - 0x42 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar7 = (uVar7 ^ 0xffffffe0) + 0x2a;
        }
        else {
          uVar7 = 0x15;
          if (0x1841 < uVar12) {
            uVar7 = 0x17 - (uVar12 < 0x5842);
          }
        }
      }
      uVar5 = uVar14 & 0xffffff;
      uVar14 = uVar14 >> 0x18 ^ uVar5;
      if (uVar14 < 10) {
        uVar8 = uVar14 + 0xfffe;
      }
      else if (uVar14 < 0x86) {
        uVar8 = 0x1f;
        uVar11 = (uint)((ulong)uVar14 - 6);
        if (uVar11 != 0) {
          for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        iVar6 = (uVar8 ^ 0xffffffe0) + 0x1f;
        uVar8 = (int)((ulong)uVar14 - 6 >> ((byte)iVar6 & 0x3f)) + iVar6 * 2 + 4;
      }
      else {
        uVar8 = 0x17;
        if (uVar14 < 0x846) {
          uVar8 = 0x1f;
          if (uVar14 - 0x46 != 0) {
            for (; uVar14 - 0x46 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          uVar8 = (uVar8 ^ 0xffffffe0) + 0x2c;
        }
      }
      uVar15 = (ulong)((uVar7 & 0xffff) << 2);
      iVar6 = *(int *)((long)kInsExtra + uVar15);
      uVar9 = (ulong)((uVar8 & 0xffff) << 2);
      uVar15 = (ulong)(uVar14 - *(int *)((long)kCopyBase + uVar9)) << ((byte)iVar6 & 0x3f) |
               (ulong)(uVar12 - *(int *)((long)kInsBase + uVar15));
      uVar12 = iVar6 + *(int *)((long)kCopyExtra + uVar9);
      if (uVar15 >> ((byte)uVar12 & 0x3f) != 0) goto LAB_00119c3b;
      if (0x38 < uVar12) goto LAB_00119c1c;
      *(ulong *)(storage + (uVar13 >> 3)) =
           uVar15 << ((byte)uVar13 & 7) | (ulong)storage[uVar13 >> 3];
      uVar13 = uVar12 + uVar13;
      *storage_ix = uVar13;
      for (; uVar10 != 0; uVar10 = uVar10 - 1) {
        bVar1 = lit_depth[input[start_pos & mask]];
        if (lit_bits[input[start_pos & mask]] >> (bVar1 & 0x3f) != 0) goto LAB_00119c3b;
        if (0x38 < bVar1) goto LAB_00119c1c;
        *(ulong *)(storage + (uVar13 >> 3)) =
             (ulong)lit_bits[input[start_pos & mask]] << ((byte)uVar13 & 7) |
             (ulong)storage[uVar13 >> 3];
        uVar13 = uVar13 + bVar1;
        *storage_ix = uVar13;
        start_pos = start_pos + 1;
      }
      if ((uVar5 != 0) && (0x7f < uVar2)) {
        bVar1 = dist_depth[uVar3];
        if (dist_bits[uVar3] >> (bVar1 & 0x3f) != 0) goto LAB_00119c3b;
        if (0x38 < bVar1) goto LAB_00119c1c;
        *(ulong *)(storage + (uVar13 >> 3)) =
             (ulong)dist_bits[uVar3] << ((byte)uVar13 & 7) | (ulong)storage[uVar13 >> 3];
        uVar13 = bVar1 + uVar13;
        *storage_ix = uVar13;
        if ((uVar4 & 0xffffff) >> ((byte)(uVar4 >> 0x18) & 0x3f) != 0) goto LAB_00119c3b;
        if (0x38ffffff < uVar4) goto LAB_00119c1c;
        *(ulong *)(storage + (uVar13 >> 3)) =
             (ulong)(uVar4 & 0xffffff) << ((byte)uVar13 & 7) | (ulong)storage[uVar13 >> 3];
        uVar13 = (uVar4 >> 0x18) + uVar13;
        *storage_ix = uVar13;
      }
      start_pos = start_pos + uVar5;
      sVar16 = sVar16 + 1;
    } while (sVar16 != n_commands);
  }
  return;
}

Assistant:

static void StoreDataWithHuffmanCodes(const uint8_t* input,
                                      size_t start_pos,
                                      size_t mask,
                                      const Command *commands,
                                      size_t n_commands,
                                      const uint8_t* lit_depth,
                                      const uint16_t* lit_bits,
                                      const uint8_t* cmd_depth,
                                      const uint16_t* cmd_bits,
                                      const uint8_t* dist_depth,
                                      const uint16_t* dist_bits,
                                      size_t* storage_ix,
                                      uint8_t* storage) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    size_t j;
    BrotliWriteBits(
        cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    for (j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      BrotliWriteBits(
          lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_;
      const uint32_t distnumextra = cmd.dist_extra_ >> 24;
      const uint32_t distextra = cmd.dist_extra_ & 0xffffff;
      BrotliWriteBits(dist_depth[dist_code], dist_bits[dist_code],
                      storage_ix, storage);
      BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}